

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_api.c
# Opt level: O2

MPP_RET h265e_proc_prep_cfg(MppEncPrepCfg *dst,MppEncPrepCfg *src)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  RK_U32 RVar6;
  RK_U32 RVar7;
  RK_S32 RVar8;
  RK_S32 RVar9;
  undefined8 uVar10;
  MppEncRotationCfg MVar11;
  RockchipSocType RVar12;
  long lVar13;
  MPP_RET MVar14;
  MppEncRotationCfg MVar15;
  uint uVar16;
  bool bVar17;
  bool bVar18;
  long lVar19;
  MppEncPrepCfg bak;
  
  uVar1 = src->change;
  if ((uVar1 == 0) &&
     (_mpp_log_l(2,"h265e_api","Assertion %s failed at %s:%d\n",(char *)0x0,"change",
                 "h265e_proc_prep_cfg",0x1ab), (mpp_debug._3_1_ & 0x10) != 0)) {
    abort();
  }
  memcpy(&bak,dst,0x84);
  if ((uVar1 & 4) != 0) {
    dst->format = src->format;
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    dst->range = src->range;
  }
  if ((uVar1 >> 0x11 & 1) != 0) {
    dst->color = src->color;
  }
  if ((uVar1 >> 0x12 & 1) != 0) {
    dst->colorprim = src->colorprim;
  }
  if ((uVar1 >> 0x13 & 1) != 0) {
    dst->colortrc = src->colortrc;
  }
  if ((uVar1 & 0x10) != 0) {
    dst->rotation_ext = src->rotation_ext;
  }
  if ((uVar1 & 0x20) != 0) {
    dst->mirroring_ext = src->mirroring_ext;
  }
  if ((uVar1 & 0x40) != 0) {
    dst->flip = src->flip;
  }
  if ((uVar1 >> 8 & 1) != 0) {
    dst->denoise = src->denoise;
  }
  if ((uVar1 >> 9 & 1) != 0) {
    (dst->sharpen).threshold = (src->sharpen).threshold;
    RVar6 = (src->sharpen).enable_y;
    RVar7 = (src->sharpen).enable_uv;
    RVar8 = (src->sharpen).coef[0];
    RVar9 = (src->sharpen).coef[1];
    uVar10 = *(undefined8 *)((src->sharpen).coef + 4);
    *(undefined8 *)((dst->sharpen).coef + 2) = *(undefined8 *)((src->sharpen).coef + 2);
    *(undefined8 *)((dst->sharpen).coef + 4) = uVar10;
    (dst->sharpen).enable_y = RVar6;
    (dst->sharpen).enable_uv = RVar7;
    (dst->sharpen).coef[0] = RVar8;
    (dst->sharpen).coef[1] = RVar9;
  }
  MVar15 = dst->rotation_ext;
  uVar16 = dst->mirroring_ext;
  if (-1 < (int)uVar16 && MVar15 < MPP_ENC_ROT_BUTT) {
    iVar2 = dst->flip;
    MVar14 = MPP_OK;
    if (-1 < iVar2) goto LAB_001c0169;
  }
  _mpp_log_l(2,"h265e_api","invalid trans: rotation %d, mirroring %d\n",(char *)0x0);
  MVar15 = dst->rotation_ext;
  uVar16 = dst->mirroring_ext;
  iVar2 = dst->flip;
  MVar14 = MPP_ERR_VALUE;
LAB_001c0169:
  MVar11 = MVar15 & MPP_ENC_ROT_270 ^ MPP_ENC_ROT_180;
  uVar3 = (uint)(uVar16 == 0);
  if (iVar2 == 0) {
    MVar11 = MVar15;
    uVar3 = uVar16;
  }
  dst->mirroring = uVar3;
  dst->rotation = MVar11;
  if ((uVar1 & 0x11) != 0) {
    if ((MVar11 | MPP_ENC_ROT_180) == MPP_ENC_ROT_270) {
      lVar13 = 4;
      lVar19 = 8;
    }
    else {
      lVar13 = 8;
      lVar19 = 4;
    }
    dst->width = *(RK_S32 *)((long)(src->sharpen).coef + lVar19 + -0x68);
    dst->height = *(RK_S32 *)((long)(src->sharpen).coef + lVar13 + -0x68);
    RVar8 = src->ver_stride;
    dst->hor_stride = src->hor_stride;
    dst->ver_stride = RVar8;
  }
  dst->change = dst->change | uVar1;
  if ((MVar11 | MPP_ENC_ROT_180) == MPP_ENC_ROT_270) {
    uVar1 = dst->width;
    uVar16 = dst->height;
    uVar3 = dst->hor_stride;
    bVar5 = (int)uVar3 < (int)uVar16;
    uVar4 = dst->ver_stride;
    bVar18 = SBORROW4(uVar1,uVar4);
    iVar2 = uVar1 - uVar4;
    bVar17 = uVar1 == uVar4;
  }
  else {
    uVar1 = dst->width;
    uVar16 = dst->height;
    uVar3 = dst->hor_stride;
    bVar5 = (int)uVar3 < (int)uVar1;
    uVar4 = dst->ver_stride;
    bVar18 = SBORROW4(uVar16,uVar4);
    iVar2 = uVar16 - uVar4;
    bVar17 = uVar16 == uVar4;
  }
  if ((bool)((!bVar17 && bVar18 == iVar2 < 0) | bVar5)) {
    _mpp_log_l(2,"h265e_api","invalid size w:h [%d:%d] stride [%d:%d]\n",(char *)0x0,(ulong)uVar1,
               (ulong)uVar16,(ulong)uVar3,(ulong)uVar4);
    MVar14 = MPP_ERR_VALUE;
  }
  if ((((dst->format & 0xf00000) != MPP_FMT_YUV420SP) &&
      (((dst->mirroring != 0 || (dst->rotation != MPP_ENC_ROT_0)) || (dst->flip != 0)))) &&
     (RVar12 = mpp_get_soc_type(), RVar12 != ROCKCHIP_SOC_RK3588)) {
    _mpp_log_l(2,"h265e_api","invalid cfg fbc data no support mirror %d, rotation %d, or flip %d",
               (char *)0x0,(ulong)(uint)dst->mirroring,(ulong)dst->rotation,(ulong)(uint)dst->flip);
    MVar14 = MPP_ERR_VALUE;
  }
  if (((dst->color < MPP_FRAME_SPC_NB && dst->range < MPP_FRAME_RANGE_NB) &&
      (dst->colorprim < MPP_FRAME_PRI_NB)) && (dst->colortrc < MPP_FRAME_TRC_NB)) {
    if (MVar14 == MPP_OK) {
      _mpp_log_l(4,"h265e_api","MPP_ENC_SET_PREP_CFG w:h [%d:%d] stride [%d:%d]\n",
                 "h265e_proc_prep_cfg",(ulong)(uint)dst->width,(ulong)(uint)dst->height,
                 (ulong)(uint)dst->hor_stride,(ulong)(uint)dst->ver_stride);
      return MPP_OK;
    }
  }
  else {
    _mpp_log_l(2,"h265e_api",
               "invalid color range %d colorspace %d primaries %d transfer characteristic %d\n",
               (char *)0x0,(ulong)dst->range,(ulong)dst->color,(ulong)dst->colorprim,
               (ulong)dst->colortrc);
    MVar14 = MPP_ERR_VALUE;
  }
  _mpp_log_l(2,"h265e_api","failed to accept new prep config\n","h265e_proc_prep_cfg");
  memcpy(dst,&bak,0x84);
  return MVar14;
}

Assistant:

static MPP_RET h265e_proc_prep_cfg(MppEncPrepCfg *dst, MppEncPrepCfg *src)
{
    MPP_RET ret = MPP_OK;
    RK_U32 change = src->change;
    RK_S32 mirroring;
    RK_S32 rotation;

    mpp_assert(change);

    MppEncPrepCfg bak = *dst;

    if (change & MPP_ENC_PREP_CFG_CHANGE_FORMAT)
        dst->format = src->format;

    if (change & MPP_ENC_PREP_CFG_CHANGE_COLOR_RANGE)
        dst->range = src->range;

    if (change & MPP_ENC_PREP_CFG_CHANGE_COLOR_SPACE)
        dst->color = src->color;

    if (change & MPP_ENC_PREP_CFG_CHANGE_COLOR_PRIME)
        dst->colorprim = src->colorprim;

    if (change & MPP_ENC_PREP_CFG_CHANGE_COLOR_TRC)
        dst->colortrc = src->colortrc;

    if (change & MPP_ENC_PREP_CFG_CHANGE_ROTATION)
        dst->rotation_ext = src->rotation_ext;

    if (change & MPP_ENC_PREP_CFG_CHANGE_MIRRORING)
        dst->mirroring_ext = src->mirroring_ext;

    if (change & MPP_ENC_PREP_CFG_CHANGE_FLIP)
        dst->flip = src->flip;

    if (change & MPP_ENC_PREP_CFG_CHANGE_DENOISE)
        dst->denoise = src->denoise;

    if (change & MPP_ENC_PREP_CFG_CHANGE_SHARPEN)
        dst->sharpen = src->sharpen;

    // parameter checking
    if (dst->rotation_ext >= MPP_ENC_ROT_BUTT || dst->rotation_ext < 0 ||
        dst->mirroring_ext < 0 || dst->flip < 0) {
        mpp_err("invalid trans: rotation %d, mirroring %d\n", dst->rotation_ext, dst->mirroring_ext);
        ret = MPP_ERR_VALUE;
    }

    /* For unifying the encoder's params used by CFG_SET and CFG_GET command,
     * there is distinction between user's set and set in hal.
     * User can externally set rotation_ext, mirroring_ext and flip,
     * which should be transformed to mirroring and rotation in hal.
     */
    mirroring = dst->mirroring_ext;
    rotation = dst->rotation_ext;

    if (dst->flip) {
        mirroring = !mirroring;
        rotation += MPP_ENC_ROT_180;
        rotation &= MPP_ENC_ROT_270;
    }

    dst->mirroring = mirroring;
    dst->rotation = rotation;

    if ((change & MPP_ENC_PREP_CFG_CHANGE_INPUT) ||
        (change & MPP_ENC_PREP_CFG_CHANGE_ROTATION)) {
        if (dst->rotation == MPP_ENC_ROT_90 || dst->rotation == MPP_ENC_ROT_270) {
            dst->width = src->height;
            dst->height = src->width;
        } else {
            dst->width = src->width;
            dst->height = src->height;
        }
        dst->hor_stride = src->hor_stride;
        dst->ver_stride = src->ver_stride;
    }

    dst->change |= change;

    // parameter checking
    if (dst->rotation == MPP_ENC_ROT_90 || dst->rotation == MPP_ENC_ROT_270) {
        if (dst->height > dst->hor_stride || dst->width > dst->ver_stride) {
            mpp_err("invalid size w:h [%d:%d] stride [%d:%d]\n",
                    dst->width, dst->height, dst->hor_stride, dst->ver_stride);
            ret = MPP_ERR_VALUE;
        }
    } else {
        if (dst->width > dst->hor_stride || dst->height > dst->ver_stride) {
            mpp_err("invalid size w:h [%d:%d] stride [%d:%d]\n",
                    dst->width, dst->height, dst->hor_stride, dst->ver_stride);
            ret = MPP_ERR_VALUE;
        }
    }

    if (MPP_FRAME_FMT_IS_FBC(dst->format) && (dst->mirroring || dst->rotation || dst->flip)) {
        // rk3588 rkvenc support fbc with rotation
        if (mpp_get_soc_type() != ROCKCHIP_SOC_RK3588) {
            mpp_err("invalid cfg fbc data no support mirror %d, rotation %d, or flip %d",
                    dst->mirroring, dst->rotation, dst->flip);
            ret = MPP_ERR_VALUE;
        }
    }

    if (dst->range >= MPP_FRAME_RANGE_NB ||
        dst->color >= MPP_FRAME_SPC_NB ||
        dst->colorprim >= MPP_FRAME_PRI_NB ||
        dst->colortrc >= MPP_FRAME_TRC_NB) {
        mpp_err("invalid color range %d colorspace %d primaries %d transfer characteristic %d\n",
                dst->range, dst->color, dst->colorprim, dst->colortrc);
        ret = MPP_ERR_VALUE;
    }

    if (ret) {
        mpp_err_f("failed to accept new prep config\n");
        *dst = bak;
    } else {
        mpp_log_f("MPP_ENC_SET_PREP_CFG w:h [%d:%d] stride [%d:%d]\n",
                  dst->width, dst->height,
                  dst->hor_stride, dst->ver_stride);
    }

    return ret;
}